

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O2

void __thiscall
irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::convertToLittleEndian<unsigned_long>
          (CXMLReaderImpl<char,_irr::io::IXMLBase> *this,unsigned_long *t)

{
  ulong uVar1;
  
  for (; uVar1 = *t, uVar1 != 0; t = t + 1) {
    *t = uVar1 << 8 | uVar1 >> 8;
  }
  return;
}

Assistant:

void convertToLittleEndian(src_char_type* t)
	{
		if (sizeof(src_char_type) == 4) 
		{
			// 32 bit

			while(*t)
			{
				*t = ((*t & 0xff000000) >> 24) |
				     ((*t & 0x00ff0000) >> 8)  |
				     ((*t & 0x0000ff00) << 8)  |
				     ((*t & 0x000000ff) << 24);
				++t;
			}
		}
		else
		{
			// 16 bit 

			while(*t)
			{
				*t = (*t >> 8) | (*t << 8);
				++t;
			}
		}
	}